

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContinuumElastic::ArchiveIN(ChContinuumElastic *this,ChArchiveIn *marchive)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::fea::ChContinuumElastic>(marchive);
  ChArchiveIn::VersionRead<chrono::fea::ChContinuumMaterial>(marchive);
  local_30 = &(this->super_ChContinuumMaterial).density;
  local_38 = "density";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->E;
  local_38 = "this->E";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->v;
  local_38 = "this->v";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  dVar1 = this->v;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar1;
  dVar2 = dVar1 + 1.0;
  this->G = this->E / (dVar2 + dVar2);
  auVar3 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar3,ZEXT816(0xc000000000000000));
  this->l = (dVar1 * this->E) / (dVar2 * auVar3._0_8_);
  ComputeStressStrainMatrix(this);
  local_30 = &this->damping_M;
  local_38 = "this->damping_M";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->damping_K;
  local_38 = "this->damping_K";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChContinuumElastic::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChContinuumElastic>();
    // deserialize parent class
    ChContinuumMaterial::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(this->E);
    marchive >> CHNVP(this->v);
    this->Set_v(this->v);  // G and l from v
    marchive >> CHNVP(this->damping_M);
    marchive >> CHNVP(this->damping_K);
}